

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_EC_Ed25519.c
# Opt level: O0

void Hacl_EC_Ed25519_mk_base_point(uint64_t *p)

{
  uint64_t *gt;
  uint64_t *gz;
  uint64_t *gy;
  uint64_t *gx;
  uint64_t *p_local;
  
  *p = 0x62d608f25d51a;
  p[1] = 0x412a4b4f6592a;
  p[2] = 0x75b7171a4b31d;
  p[3] = 0x1ff60527118fe;
  p[4] = 0x216936d3cd6e5;
  p[5] = 0x6666666666658;
  p[6] = 0x4cccccccccccc;
  p[7] = 0x1999999999999;
  p[8] = 0x3333333333333;
  p[9] = 0x6666666666666;
  p[10] = 1;
  p[0xb] = 0;
  p[0xc] = 0;
  p[0xd] = 0;
  p[0xe] = 0;
  p[0xf] = 0x68ab3a5b7dda3;
  p[0x10] = 0xeea2a5eadbb;
  p[0x11] = 0x2af8df483c27e;
  p[0x12] = 0x332b375274732;
  p[0x13] = 0x67875f0fd78b7;
  return;
}

Assistant:

void Hacl_EC_Ed25519_mk_base_point(uint64_t *p)
{
  uint64_t *gx = p;
  uint64_t *gy = p + 5U;
  uint64_t *gz = p + 10U;
  uint64_t *gt = p + 15U;
  gx[0U] = 0x00062d608f25d51aULL;
  gx[1U] = 0x000412a4b4f6592aULL;
  gx[2U] = 0x00075b7171a4b31dULL;
  gx[3U] = 0x0001ff60527118feULL;
  gx[4U] = 0x000216936d3cd6e5ULL;
  gy[0U] = 0x0006666666666658ULL;
  gy[1U] = 0x0004ccccccccccccULL;
  gy[2U] = 0x0001999999999999ULL;
  gy[3U] = 0x0003333333333333ULL;
  gy[4U] = 0x0006666666666666ULL;
  gz[0U] = 1ULL;
  gz[1U] = 0ULL;
  gz[2U] = 0ULL;
  gz[3U] = 0ULL;
  gz[4U] = 0ULL;
  gt[0U] = 0x00068ab3a5b7dda3ULL;
  gt[1U] = 0x00000eea2a5eadbbULL;
  gt[2U] = 0x0002af8df483c27eULL;
  gt[3U] = 0x000332b375274732ULL;
  gt[4U] = 0x00067875f0fd78b7ULL;
}